

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::ArrayReductionMethod::eval
          (ArrayReductionMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *callInfo)

{
  bool bVar1;
  undefined1 uVar2;
  type *ppEVar3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  long in_RSI;
  ConstantValue *in_RDI;
  SVInt result_1;
  CVIterator<false> it_1;
  Type *elemType_1;
  SVInt result;
  ConstantValue cv;
  ConstantValue *iterVal;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_EvalContext_h:113:13)>
  guard;
  CVIterator<false> it;
  not_null<const_slang::ast::Type_*> elemType;
  type *iterVar;
  type *iterExpr;
  ConstantValue arr;
  CVIterator<false> *in_stack_fffffffffffffcd8;
  EvalContext *in_stack_fffffffffffffce0;
  Type *in_stack_fffffffffffffce8;
  bitwidth_t bVar4;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  ConstantValue *in_stack_fffffffffffffd10;
  ValueSymbol *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  EvalContext *in_stack_fffffffffffffd38;
  
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval((Expression *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x909db0);
  if (bVar1) {
    CallExpression::SystemCallInfo::getIteratorInfo
              ((SystemCallInfo *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
    ppEVar3 = std::get<0ul,slang::ast::Expression_const*,slang::ast::ValueSymbol_const*>
                        ((pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*> *)
                         0x909e4e);
    std::get<1ul,slang::ast::Expression_const*,slang::ast::ValueSymbol_const*>
              ((pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*> *)0x909e63);
    if (*ppEVar3 == (type)0x0) {
      bVar1 = slang::ConstantValue::empty((ConstantValue *)0x90a348);
      if (bVar1) {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0)
        ;
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0x90a378);
        Type::getArrayElementType(in_stack_fffffffffffffce8);
        Type::getBitWidth(in_stack_fffffffffffffce8);
        bVar4 = (bitwidth_t)((ulong)in_stack_fffffffffffffce8 >> 0x20);
        Type::isSigned((Type *)in_stack_fffffffffffffce0);
        SVInt::SVInt((SVInt *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),bVar4,
                     (uint64_t)in_stack_fffffffffffffce0,
                     SUB81((ulong)in_stack_fffffffffffffcd8 >> 0x38,0));
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffce0,(SVInt *)in_stack_fffffffffffffcd8);
        SVInt::~SVInt((SVInt *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
      }
      else {
        begin<slang::ConstantValue,_false>((ConstantValue *)in_stack_fffffffffffffce8);
        iterator_facade<slang::CVIterator<false>,_false>::operator->
                  ((iterator_facade<slang::CVIterator<false>,_false> *)0x90a462);
        slang::ConstantValue::integer((ConstantValue *)0x90a473);
        SVInt::SVInt((SVInt *)in_stack_fffffffffffffce0,(SVInt *)in_stack_fffffffffffffcd8);
        iterator_facade<slang::CVIterator<false>,_false>::operator++<slang::CVIterator<false>_>
                  ((iterator_facade<slang::CVIterator<false>,_false> *)in_stack_fffffffffffffce0);
        while( true ) {
          end<slang::ConstantValue,_false>((ConstantValue *)in_stack_fffffffffffffce8);
          uVar2 = operator==<slang::CVIterator<false>_>
                            ((self_type *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          if (((uVar2 ^ 0xff) & 1) == 0) break;
          in_stack_fffffffffffffce0 = (EvalContext *)(in_RSI + 0x38);
          in_stack_fffffffffffffce8 =
               (Type *)iterator_facade<slang::CVIterator<false>,_false>::operator->
                                 ((iterator_facade<slang::CVIterator<false>,_false> *)0x90a4fe);
          in_stack_fffffffffffffcd8 =
               (CVIterator<false> *)slang::ConstantValue::integer((ConstantValue *)0x90a50f);
          function_ref<void_(slang::SVInt_&,_const_slang::SVInt_&)>::operator()
                    ((function_ref<void_(slang::SVInt_&,_const_slang::SVInt_&)> *)
                     in_stack_fffffffffffffce0,(SVInt *)in_stack_fffffffffffffcd8,(SVInt *)0x90a52b)
          ;
          iterator_facade<slang::CVIterator<false>,_false>::operator++<slang::CVIterator<false>_>
                    ((iterator_facade<slang::CVIterator<false>,_false> *)in_stack_fffffffffffffce0);
        }
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffce0,(SVInt *)in_stack_fffffffffffffcd8);
        SVInt::~SVInt((SVInt *)CONCAT17(uVar2,in_stack_fffffffffffffcf0));
      }
    }
    else {
      bVar1 = slang::ConstantValue::empty((ConstantValue *)0x909e90);
      if (bVar1) {
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0x909ecd);
        Type::getBitWidth(in_stack_fffffffffffffce8);
        bVar4 = (bitwidth_t)((ulong)in_stack_fffffffffffffce8 >> 0x20);
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0x909efa);
        Type::isSigned((Type *)in_stack_fffffffffffffce0);
        SVInt::SVInt((SVInt *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),bVar4,
                     (uint64_t)in_stack_fffffffffffffce0,
                     SUB81((ulong)in_stack_fffffffffffffcd8 >> 0x38,0));
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffce0,(SVInt *)in_stack_fffffffffffffcd8);
        SVInt::~SVInt((SVInt *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
      }
      else {
        begin<slang::ConstantValue,_false>((ConstantValue *)in_stack_fffffffffffffce8);
        EvalContext::disableCaching(in_stack_fffffffffffffd38);
        iterator_facade<slang::CVIterator<false>,_false>::operator*
                  ((iterator_facade<slang::CVIterator<false>,_false> *)0x909ff9);
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffce0,
                   (ConstantValue *)in_stack_fffffffffffffcd8);
        EvalContext::createLocal
                  ((EvalContext *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                   in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
        slang::ConstantValue::~ConstantValue((ConstantValue *)0x90a04e);
        Expression::eval((Expression *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
        bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x90a08d);
        if (bVar1) {
          slang::ConstantValue::integer((ConstantValue *)0x90a12b);
          SVInt::SVInt((SVInt *)in_stack_fffffffffffffce0,(SVInt *)in_stack_fffffffffffffcd8);
          iterator_facade<slang::CVIterator<false>,_false>::operator++<slang::CVIterator<false>_>
                    ((iterator_facade<slang::CVIterator<false>,_false> *)in_stack_fffffffffffffce0);
          while( true ) {
            end<slang::ConstantValue,_false>((ConstantValue *)in_stack_fffffffffffffce8);
            bVar1 = operator==<slang::CVIterator<false>_>
                              ((self_type *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
            if (((bVar1 ^ 0xffU) & 1) == 0) break;
            iterator_facade<slang::CVIterator<false>,_false>::operator*
                      ((iterator_facade<slang::CVIterator<false>,_false> *)0x90a1b1);
            slang::ConstantValue::operator=
                      ((ConstantValue *)in_stack_fffffffffffffce0,
                       (ConstantValue *)in_stack_fffffffffffffcd8);
            Expression::eval((Expression *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
            slang::ConstantValue::operator=
                      ((ConstantValue *)in_stack_fffffffffffffce0,
                       (ConstantValue *)in_stack_fffffffffffffcd8);
            slang::ConstantValue::~ConstantValue((ConstantValue *)0x90a217);
            bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x90a221);
            if (!bVar1) {
              slang::ConstantValue::ConstantValue
                        ((ConstantValue *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
              goto LAB_0090a2f0;
            }
            slang::ConstantValue::integer((ConstantValue *)0x90a298);
            function_ref<void_(slang::SVInt_&,_const_slang::SVInt_&)>::operator()
                      ((function_ref<void_(slang::SVInt_&,_const_slang::SVInt_&)> *)
                       in_stack_fffffffffffffce0,(SVInt *)in_stack_fffffffffffffcd8,
                       (SVInt *)0x90a2b6);
            iterator_facade<slang::CVIterator<false>,_false>::operator++<slang::CVIterator<false>_>
                      ((iterator_facade<slang::CVIterator<false>,_false> *)in_stack_fffffffffffffce0
                      );
          }
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffce0,(SVInt *)in_stack_fffffffffffffcd8);
LAB_0090a2f0:
          SVInt::~SVInt((SVInt *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
        }
        else {
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        }
        slang::ConstantValue::~ConstantValue((ConstantValue *)0x90a30a);
        ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/EvalContext.h:113:13)>
        ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_EvalContext_h:113:13)>
                       *)in_stack_fffffffffffffce0);
      }
    }
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x90a5a2);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo& callInfo) const final {
        ConstantValue arr = args[0]->eval(context);
        if (!arr)
            return nullptr;

        auto [iterExpr, iterVar] = callInfo.getIteratorInfo();
        if (iterExpr) {
            SLANG_ASSERT(iterVar);
            if (arr.empty()) {
                auto elemType = iterExpr->type;
                return SVInt(elemType->getBitWidth(), 0, elemType->isSigned());
            }

            auto it = begin(arr);
            auto guard = context.disableCaching();
            auto iterVal = context.createLocal(iterVar, *it);
            ConstantValue cv = iterExpr->eval(context);
            if (!cv)
                return nullptr;

            SVInt result = cv.integer();
            for (++it; it != end(arr); ++it) {
                *iterVal = *it;
                cv = iterExpr->eval(context);
                if (!cv)
                    return nullptr;

                op(result, cv.integer());
            }

            return result;
        }
        else {
            if (arr.empty()) {
                auto elemType = args[0]->type->getArrayElementType();
                return SVInt(elemType->getBitWidth(), 0, elemType->isSigned());
            }

            auto it = begin(arr);
            SVInt result = it->integer();
            for (++it; it != end(arr); ++it)
                op(result, it->integer());

            return result;
        }
    }